

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void setup::anon_unknown_21::check_is_end(pointer *is,char *what)

{
  pointer pbVar1;
  ulong uVar2;
  char *pcVar3;
  error_code *in_RSI;
  char dummy;
  error_code local_28;
  error_code *local_10;
  
  local_10 = in_RSI;
  pbVar1 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x178a58);
  std::ios::exceptions((int)pbVar1 + (int)pbVar1->_vptr_basic_istream[-3]);
  pbVar1 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x178a73);
  std::istream::get((char *)pbVar1);
  uVar2 = std::ios::eof();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>(&local_28,(io_errc)((ulong)local_10 >> 0x20));
    std::ios_base::failure[abi:cxx11]::failure(pcVar3,local_10);
    __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  return;
}

Assistant:

void check_is_end(stream::block_reader::pointer & is, const char * what) {
	is->exceptions(std::ios_base::goodbit);
	char dummy;
	if(!is->get(dummy).eof()) {
		throw std::ios_base::failure(what);
	}
}